

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

void __thiscall cmCPackArchiveGenerator::~cmCPackArchiveGenerator(cmCPackArchiveGenerator *this)

{
  (this->super_cmCPackGenerator).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCPackArchiveGenerator_005bc428;
  std::__cxx11::string::~string((string *)&this->ArchiveFormat);
  cmCPackGenerator::~cmCPackGenerator(&this->super_cmCPackGenerator);
  return;
}

Assistant:

cmCPackArchiveGenerator::~cmCPackArchiveGenerator()
{
}